

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O2

void blend_untransformed_rgb565(int count,QT_FT_Span *spans,void *userData)

{
  char cVar1;
  QThreadPool *pQVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  int iVar5;
  ulong uVar6;
  int iVar7;
  long in_FS_OFFSET;
  QSemaphore semaphore;
  anon_class_32_6_a7326c45 local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*(int *)((long)userData + 0xd0) != 7) ||
     ((*(int *)(*userData + 0xc) != 0 && (*(int *)(*userData + 0xc) != 3)))) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      blend_untransformed_generic(count,spans,userData);
      return;
    }
    goto LAB_005bcfc0;
  }
  local_58.yoff =
       -(int)((double)((ulong)-*(double *)((long)userData + 0x78) & 0x8000000000000000 |
                      0x3fe0000000000000) - *(double *)((long)userData + 0x78));
  local_58.xoff =
       -(int)((double)((ulong)-*(double *)((long)userData + 0x70) & 0x8000000000000000 |
                      0x3fe0000000000000) - *(double *)((long)userData + 0x70));
  local_58.image_width = (int)*(undefined8 *)((long)userData + 0xb0);
  local_58.image_height = (int)((ulong)*(undefined8 *)((long)userData + 0xb0) >> 0x20);
  uVar6 = (long)(count + 0x20) / 0x40 & 0xffffffff;
  local_58.spans = spans;
  local_58.data = (QSpanData *)userData;
  pQVar2 = QGuiApplicationPrivate::qtGuiThreadPool();
  if (((count < 0x60) || (pQVar2 == (QThreadPool *)0x0)) ||
     ((int)qPixelLayouts[*(uint *)(*userData + 0x10)].bpp < 3)) {
LAB_005bcea8:
    blend_untransformed_rgb565::anon_class_32_6_a7326c45::operator()(&local_58,0,count);
  }
  else {
    QThread::currentThread();
    cVar1 = QThreadPool::contains((QThread *)pQVar2);
    if (cVar1 != '\0') goto LAB_005bcea8;
    _semaphore = &DAT_aaaaaaaaaaaaaaaa;
    iVar5 = 0;
    QSemaphore::QSemaphore(&semaphore,0);
    while( true ) {
      iVar7 = (int)uVar6;
      uVar6 = (ulong)(iVar7 - 1);
      if (iVar7 == 0) break;
      iVar7 = (count - iVar5) / iVar7;
      puVar3 = (undefined8 *)operator_new(0x18);
      *(undefined1 *)(puVar3 + 1) = 1;
      *puVar3 = QFactoryLoader::keyMap;
      puVar4 = (undefined8 *)operator_new(0x20);
      *puVar4 = QRunnable::QGenericRunnable::
                Helper<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/gui/painting/qdrawhelper.cpp:4680:5)>
                ::impl;
      *(int *)(puVar4 + 1) = iVar5;
      *(int *)((long)puVar4 + 0xc) = iVar7;
      puVar4[2] = &local_58;
      puVar4[3] = &semaphore;
      puVar3[2] = puVar4;
      QThreadPool::start((QRunnable *)pQVar2,(int)puVar3);
      iVar5 = iVar5 + iVar7;
    }
    QSemaphore::acquire((int)&semaphore);
    QSemaphore::~QSemaphore(&semaphore);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_005bcfc0:
  __stack_chk_fail();
}

Assistant:

static void blend_untransformed_rgb565(int count, const QT_FT_Span *spans, void *userData)
{
    QSpanData *data = reinterpret_cast<QSpanData*>(userData);
    QPainter::CompositionMode mode = data->rasterBuffer->compositionMode;

    if (data->texture.format != QImage::Format_RGB16
            || (mode != QPainter::CompositionMode_SourceOver
                && mode != QPainter::CompositionMode_Source))
    {
        blend_untransformed_generic(count, spans, userData);
        return;
    }

    const int image_width = data->texture.width;
    const int image_height = data->texture.height;
    int xoff = -qRound(-data->dx);
    int yoff = -qRound(-data->dy);

    auto function = [=](int cStart, int cEnd)
    {
        for (int c = cStart; c < cEnd; ++c) {
            if (!spans[c].len)
                continue;
            const quint8 coverage = (data->texture.const_alpha * spans[c].coverage) >> 8;
            if (coverage == 0)
                continue;

            int x = spans[c].x;
            int length = spans[c].len;
            int sx = xoff + x;
            int sy = yoff + spans[c].y;
            if (sy >= 0 && sy < image_height && sx < image_width) {
                if (sx < 0) {
                    x -= sx;
                    length += sx;
                    sx = 0;
                }
                if (sx + length > image_width)
                    length = image_width - sx;
                if (length > 0) {
                    quint16 *dest = (quint16 *)data->rasterBuffer->scanLine(spans[c].y) + x;
                    const quint16 *src = (const quint16 *)data->texture.scanLine(sy) + sx;
                    if (coverage == 255) {
                        memcpy(dest, src, length * sizeof(quint16));
                    } else {
                        const quint8 alpha = (coverage + 1) >> 3;
                        const quint8 ialpha = 0x20 - alpha;
                        if (alpha > 0)
                            blend_sourceOver_rgb16_rgb16(dest, src, length, alpha, ialpha);
                    }
                }
            }
        }
    };
    QT_THREAD_PARALLEL_FILLS(function);
}